

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::AddCMakeDependFilesFromUser(cmMakefile *this)

{
  bool bVar1;
  string *psVar2;
  char local_a9;
  undefined1 local_a8 [8];
  string f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dep;
  iterator __end1;
  iterator __begin1;
  cmList *__range1;
  allocator<char> local_51;
  string local_50;
  cmValue local_30;
  cmValue deps_str;
  cmList deps;
  cmMakefile *this_local;
  
  cmList::cmList((cmList *)&deps_str);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"CMAKE_CONFIGURE_DEPENDS",&local_51);
  local_30 = GetProperty(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  bVar1 = cmValue::operator_cast_to_bool(&local_30);
  if (bVar1) {
    psVar2 = cmValue::operator*[abi_cxx11_(&local_30);
    cmList::assign((cmList *)&deps_str,psVar2,Yes,No);
  }
  __end1 = cmList::begin_abi_cxx11_((cmList *)&deps_str);
  dep = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        cmList::end_abi_cxx11_((cmList *)&deps_str);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&dep), bVar1) {
    f.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    bVar1 = cmsys::SystemTools::FileIsFullPath((string *)f.field_2._8_8_);
    if (bVar1) {
      AddCMakeDependFile(this,(string *)f.field_2._8_8_);
    }
    else {
      psVar2 = GetCurrentSourceDirectory_abi_cxx11_(this);
      local_a9 = '/';
      cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&>
                ((string *)local_a8,psVar2,&local_a9,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 f.field_2._8_8_);
      AddCMakeDependFile(this,(string *)local_a8);
      std::__cxx11::string::~string((string *)local_a8);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  cmList::~cmList((cmList *)&deps_str);
  return;
}

Assistant:

void cmMakefile::AddCMakeDependFilesFromUser()
{
  cmList deps;
  if (cmValue deps_str = this->GetProperty("CMAKE_CONFIGURE_DEPENDS")) {
    deps.assign(*deps_str);
  }
  for (auto const& dep : deps) {
    if (cmSystemTools::FileIsFullPath(dep)) {
      this->AddCMakeDependFile(dep);
    } else {
      std::string f = cmStrCat(this->GetCurrentSourceDirectory(), '/', dep);
      this->AddCMakeDependFile(f);
    }
  }
}